

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# end.c
# Opt level: O1

void artifact_score(obj *list,boolean counting,menulist *menu)

{
  int iVar1;
  boolean bVar2;
  long amount;
  char *pcVar3;
  char *pcVar4;
  nh_menuitem *pnVar5;
  long lVar6;
  obj *otmp;
  char *pcVar7;
  short dummy;
  char pbuf [256];
  short local_13a;
  char local_138 [264];
  
  if (list != (obj *)0x0) {
    do {
      if (((list->oartifact != '\0') || ((ushort)list->otyp - 0x10b < 2)) || (list->otyp == 0x1bd))
      {
        amount = arti_cost(list);
        lVar6 = (amount * 5) / 2;
        if (counting == '\0') {
          discover_object((int)list->otyp,'\x01','\x01');
          list->field_0x4a = list->field_0x4a | 0xf0;
          bVar2 = the_unique_obj(list);
          pcVar7 = "";
          if (bVar2 != '\0') {
            pcVar7 = "The ";
          }
          if (list->oartifact == '\0') {
            pcVar3 = obj_descr[objects[list->otyp].oc_name_idx].oc_name;
          }
          else {
            pcVar3 = xname(list);
            pcVar3 = artifact_name(pcVar3,&local_13a);
          }
          pcVar4 = currency(amount);
          sprintf(local_138,"%s%s (worth %ld %s and %ld points)",pcVar7,pcVar3,amount,pcVar4,lVar6);
          iVar1 = menu->size;
          if (iVar1 <= menu->icount) {
            menu->size = iVar1 * 2;
            pnVar5 = (nh_menuitem *)realloc(menu->items,(long)iVar1 * 0x218);
            menu->items = pnVar5;
          }
          pnVar5 = menu->items + menu->icount;
          pnVar5->id = 0;
          pnVar5->role = MI_TEXT;
          pnVar5->accel = '\0';
          pnVar5->group_accel = '\0';
          pnVar5->selected = '\0';
          strcpy(pnVar5->caption,local_138);
          menu->icount = menu->icount + 1;
        }
        else {
          u.urscore = u.urscore + (int)lVar6;
        }
      }
      if (list->cobj != (obj *)0x0) {
        artifact_score(list->cobj,counting,menu);
      }
      list = list->nobj;
    } while (list != (obj *)0x0);
  }
  return;
}

Assistant:

static void artifact_score(struct obj *list,
			   boolean counting, /* true => add up points; false => display them */
			   struct menulist *menu)
{
    char pbuf[BUFSZ];
    struct obj *otmp;
    long value, points;
    short dummy;	/* object type returned by artifact_name() */

    for (otmp = list; otmp; otmp = otmp->nobj) {
	if (otmp->oartifact ||
			otmp->otyp == BELL_OF_OPENING ||
			otmp->otyp == SPE_BOOK_OF_THE_DEAD ||
			otmp->otyp == CANDELABRUM_OF_INVOCATION) {
	    value = arti_cost(otmp);	/* zorkmid value */
	    points = value * 5 / 2;	/* score value */
	    if (counting) {
		u.urscore += points;
	    } else {
		makeknown(otmp->otyp);
		otmp->known = otmp->dknown = otmp->bknown = otmp->rknown = 1;
		/* assumes artifacts don't have quan > 1 */
		sprintf(pbuf, "%s%s (worth %ld %s and %ld points)",
			the_unique_obj(otmp) ? "The " : "",
			otmp->oartifact ? artifact_name(xname(otmp), &dummy) :
				OBJ_NAME(objects[otmp->otyp]),
			value, currency(value), points);
		add_menutext(menu, pbuf);
	    }
	}
	if (Has_contents(otmp))
	    artifact_score(otmp->cobj, counting, menu);
    }
}